

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O1

Float __thiscall pbrt::PiecewiseConstant2D::PDF(PiecewiseConstant2D *this,Point2f *pr)

{
  float fVar1;
  Tuple2<pbrt::Point2,_float> TVar2;
  PiecewiseConstant1D *pPVar3;
  size_t sVar4;
  undefined1 auVar5 [12];
  int iVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 in_XMM3 [16];
  
  auVar10._8_8_ = 0;
  auVar10._0_8_ = pr->super_Tuple2<pbrt::Point2,_float>;
  TVar2 = (this->domain).pMin.super_Tuple2<pbrt::Point2,_float>;
  auVar12._8_8_ = 0;
  auVar12._0_4_ = TVar2.x;
  auVar12._4_4_ = TVar2.y;
  auVar11 = vsubps_avx(auVar10,auVar12);
  fVar1 = (this->domain).pMax.super_Tuple2<pbrt::Point2,_float>.x;
  if (TVar2.x < fVar1) {
    auVar5 = auVar11._4_12_;
    auVar11._0_4_ = auVar11._0_4_ / (fVar1 - TVar2.x);
    auVar11._4_12_ = auVar5;
  }
  fVar1 = (this->domain).pMax.super_Tuple2<pbrt::Point2,_float>.y;
  auVar10 = vmovshdup_avx(auVar12);
  if (auVar10._0_4_ < fVar1) {
    auVar12 = vmovshdup_avx(auVar11);
    auVar13._0_4_ = auVar12._0_4_ / (fVar1 - auVar10._0_4_);
    auVar13._4_12_ = auVar12._4_12_;
    auVar11 = vinsertps_avx(auVar11,auVar13,0x10);
  }
  auVar10 = vmovshdup_avx(auVar11);
  pPVar3 = (this->pConditionalV).ptr;
  sVar4 = (pPVar3->func).nStored;
  auVar12 = vcvtusi2ss_avx512f(in_XMM3,sVar4);
  iVar8 = (int)(auVar11._0_4_ * auVar12._0_4_);
  uVar7 = sVar4 - 1;
  iVar6 = (int)uVar7;
  if ((ulong)(long)iVar8 <= uVar7) {
    iVar6 = iVar8;
  }
  if (iVar8 < 0) {
    iVar6 = 0;
  }
  sVar4 = (this->pMarginal).func.nStored;
  auVar11 = vcvtusi2ss_avx512f(in_XMM3,sVar4);
  iVar9 = (int)(auVar10._0_4_ * auVar11._0_4_);
  uVar7 = sVar4 - 1;
  iVar8 = (int)uVar7;
  if ((ulong)(long)iVar9 <= uVar7) {
    iVar8 = iVar9;
  }
  if (iVar9 < 0) {
    iVar8 = 0;
  }
  return pPVar3[iVar8].func.ptr[iVar6] / (this->pMarginal).funcInt;
}

Assistant:

PBRT_CPU_GPU auto operator-(const Point2<U> &p) const
        -> Vector2<decltype(T{} - U{})> {
        DCHECK(!p.HasNaN());
        return {x - p.x, y - p.y};
    }